

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall r_code::SysObject::SysObject(SysObject *this,Code *source)

{
  iterator __position;
  ushort uVar1;
  uint32_t uVar2;
  Atom *a;
  Atom *this_00;
  SysView *this_01;
  SysView **ppSVar3;
  long *plVar4;
  size_t i;
  ulong uVar5;
  uint local_34;
  
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_ImageObject)._vptr_ImageObject = (_func_int **)&PTR__SysObject_0010cc78;
  (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->views).m_vector.super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->views).m_vector.super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->views).m_vector.super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = 0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)source + 0x30))(source);
    if (uVar1 <= uVar5) break;
    a = (Atom *)(**(code **)(*(long *)source + 0x20))(source,uVar5 & 0xffff);
    this_00 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,uVar5);
    Atom::operator=(this_00,a);
    uVar5 = uVar5 + 1;
  }
  (**(code **)(*(long *)source + 0x88))(source);
  plVar4 = *(long **)(source + 0x68);
  if (plVar4 != (long *)0x0) {
    i = 0;
    do {
      this_01 = (SysView *)operator_new(0x38);
      SysView::SysView(this_01,(View *)plVar4[1]);
      ppSVar3 = vector<r_code::SysView_*>::operator[](&this->views,i);
      *ppSVar3 = this_01;
      i = i + 1;
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  (**(code **)(*(long *)source + 0x90))(source);
  uVar2 = (**(code **)(*(long *)source + 0x10))(source);
  this->oid = uVar2;
  uVar5 = 0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)source + 0x50))(source);
    if (uVar1 <= uVar5) break;
    local_34 = 0;
    __position._M_current =
         (this->super_ImageObject).references.m_vector.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_ImageObject).references.m_vector.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                 &(this->super_ImageObject).references,__position,&local_34);
    }
    else {
      *__position._M_current = 0;
      (this->super_ImageObject).references.m_vector.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

SysObject::SysObject(Code *source)
{
    size_t i;

    for (i = 0; i < source->code_size(); ++i) {
        code[i] = source->code(i);
    }

    std::unordered_set<View *, View::Hash, View::Equal>::const_iterator v;
    source->acq_views();

    for (i = 0, v = source->views.begin(); v != source->views.end(); ++i, ++v) {
        views[i] = new SysView(*v);
    }

    source->rel_views();
    oid = source->get_oid();

    for (i = 0; i < source->references_size(); ++i) { // to get the right size in Image::add_object().
        references.push_back(0);
    }
}